

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O2

RK_S32 mpp_av1_read_obu_header(AV1Context *ctx,BitReadCtx_t *gb,AV1RawOBUHeader *current)

{
  ushort uVar1;
  uint5 uVar2;
  RK_S32 RVar3;
  ulong uVar4;
  RK_U32 value;
  
  RVar3 = mpp_av1_read_unsigned(gb,1,"obu_forbidden_bit",&value,0,0);
  if (RVar3 < 0) {
    return RVar3;
  }
  current->obu_forbidden_bit = (RK_U8)value;
  RVar3 = mpp_av1_read_unsigned(gb,4,"obu_type",&value,0,0xf);
  if (-1 < RVar3) {
    current->obu_type = (RK_U8)value;
    RVar3 = mpp_av1_read_unsigned(gb,1,"obu_extension_flag",&value,0,1);
    if (-1 < RVar3) {
      current->obu_extension_flag = (RK_U8)value;
      RVar3 = mpp_av1_read_unsigned(gb,1,"obu_has_size_field",&value,0,1);
      if (-1 < RVar3) {
        current->obu_has_size_field = (RK_U8)value;
        RVar3 = mpp_av1_read_unsigned(gb,1,"obu_reserved_1bit",&value,0,0);
        if (-1 < RVar3) {
          current->obu_reserved_1bit = (RK_U8)value;
          if (current->obu_extension_flag == '\0') {
            current->temporal_id = '\0';
            current->spatial_id = '\0';
            uVar4 = 0;
LAB_001b6979:
            ctx->temporal_id = (int)uVar4;
            ctx->spatial_id = (int)(uVar4 >> 0x20);
            return 0;
          }
          RVar3 = mpp_av1_read_unsigned(gb,3,"temporal_id",&value,0,7);
          if (-1 < RVar3) {
            current->temporal_id = (RK_U8)value;
            RVar3 = mpp_av1_read_unsigned(gb,2,"spatial_id",&value,0,3);
            if (-1 < RVar3) {
              current->spatial_id = (RK_U8)value;
              RVar3 = mpp_av1_read_unsigned(gb,3,"extension_header_reserved_3bits",&value,0,0);
              if (-1 < RVar3) {
                current->extension_header_reserved_3bits = (RK_U8)value;
                uVar1._0_1_ = current->temporal_id;
                uVar1._1_1_ = current->spatial_id;
                uVar2 = CONCAT14(uVar1._1_1_,(uint)(uVar1 & 0xff));
                uVar4 = (ulong)uVar2;
                goto LAB_001b6979;
              }
            }
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

static RK_S32 mpp_av1_read_obu_header(AV1Context *ctx, BitReadCtx_t *gb,
                                      AV1RawOBUHeader *current)
{
    RK_S32 err;

    fc(1, obu_forbidden_bit, 0, 0);

    fc(4, obu_type, 0, AV1_OBU_PADDING);
    flag(obu_extension_flag);
    flag(obu_has_size_field);

    fc(1, obu_reserved_1bit, 0, 0);

    if (current->obu_extension_flag) {
        fb(3, temporal_id);
        fb(2, spatial_id);
        fc(3, extension_header_reserved_3bits, 0, 0);
    } else {
        infer(temporal_id, 0);
        infer(spatial_id, 0);
    }

    ctx->temporal_id = current->temporal_id;
    ctx->spatial_id  = current->spatial_id;

    return 0;
}